

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestTestMacros.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_21e63::TestFixtureCtorThrowsFixtureCtorThrowsTestName::RunImpl
          (TestFixtureCtorThrowsFixtureCtorThrowsTestName *this)

{
  AssertException *e;
  MemoryOutStream stream;
  exception *e_1;
  FixtureCtorThrowsFixtureCtorThrowsTestNameHelper local_20;
  FixtureCtorThrowsFixtureCtorThrowsTestNameHelper fixtureHelper;
  bool ctorOk;
  TestFixtureCtorThrowsFixtureCtorThrowsTestName *this_local;
  
  fixtureHelper.m_details._7_1_ = 0;
  FixtureCtorThrowsFixtureCtorThrowsTestNameHelper::FixtureCtorThrowsFixtureCtorThrowsTestNameHelper
            (&local_20,&(this->super_Test).m_details);
  fixtureHelper.m_details._7_1_ = 1;
  UnitTest::ExecuteTest<(anonymous_namespace)::FixtureCtorThrowsFixtureCtorThrowsTestNameHelper>
            (&local_20,&(this->super_Test).m_details);
  return;
}

Assistant:

TEST_FIXTURE_EX(FixtureCtorThrows, FixtureCtorThrowsTestName, throwingFixtureTestList1)
{
}